

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppcVar4;
  cmLocalGenerator *this_00;
  pointer pcVar5;
  string *psVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  bool bVar10;
  pointer unaff_RBP;
  char *unaff_R15;
  string cleanScriptAbs;
  string cleanScriptRel;
  cmGeneratedFileStream fout;
  string local_348;
  string local_328;
  string local_308;
  cmLocalGenerator *local_2e8;
  string local_2e0;
  ostream *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_278 [32];
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  pointer pbStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  pointer pbStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  pointer pbStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  pointer pbStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  _Base_ptr local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  _Alloc_hider local_190;
  undefined1 local_188 [24];
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  bool local_158;
  
  ppcVar4 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_2c0 = os;
  if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppcVar4) {
    uVar9 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
    if (local_348._M_dataplus._M_p != unaff_R15) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_328._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar9);
  }
  this_00 = *ppcVar4;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"CMakeFiles/clean_additional.cmake","");
  local_2e8 = this_00;
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  pcVar5 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,pcVar5,pcVar5 + psVar6->_M_string_length);
  std::__cxx11::string::push_back((char)&local_308);
  std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2e0._M_dataplus._M_p);
  if ((this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    cmsys::SystemTools::RemoveFile(&local_308);
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,&local_308,false,None);
    if ((*(byte *)((long)&local_258._M_p + *(long *)(local_278._0_8_ + -0x18)) & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"# Additional clean files\n\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"file(REMOVE_RECURSE\n",0x14);
      p_Var8 = (this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ",2);
          psVar6 = ConvertToNinjaPath(this,(string *)(p_Var8 + 1));
          cmOutputConverter::EscapeForCMake(&local_348,psVar6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,local_348._M_dataplus._M_p,
                              local_348._M_string_length);
          local_328._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_328,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")\n",2);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2e8->Makefile->OutputFiles,&local_308);
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CLEAN_ADDITIONAL","");
      if (local_298 == &local_288) {
        local_278._24_8_ = local_288._8_8_;
        local_278._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_278 + 0x10);
      }
      else {
        local_278._0_8_ = local_298;
      }
      local_278._16_8_ = (ulong)(uint7)local_288._M_allocated_capacity._1_7_ << 8;
      local_278._8_8_ = local_290;
      local_290 = 0;
      local_288._M_local_buf[0] = '\0';
      local_250 = 0;
      local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
      local_238._M_p = (pointer)&local_228;
      pbStack_230 = (pointer)0x0;
      local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
      local_218._M_p = (pointer)&local_208;
      pbStack_210 = (pointer)0x0;
      local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
      local_1f8._M_p = (pointer)&local_1e8;
      pbStack_1f0 = (pointer)0x0;
      local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
      local_1d8._M_p = (pointer)&local_1c8;
      pbStack_1d0 = (pointer)0x0;
      local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
      local_1b8._M_p = (pointer)&local_1a8;
      local_1b0 = (_Base_ptr)0x0;
      local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
      local_198._M_p = local_188;
      local_190._M_p = (pointer)0x0;
      local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
      local_188._16_8_ = &local_168;
      local_170 = 0;
      local_168._M_local_buf[0] = '\0';
      local_158 = false;
      local_298 = &local_288;
      local_258._M_p = (pointer)&local_248;
      CMakeCmd_abi_cxx11_(&local_348,this);
      std::__cxx11::string::operator=((string *)&local_258,(string *)&local_348);
      paVar2 = &local_348.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_258);
      NinjaOutputPath(&local_328,this,&local_2e0);
      cmOutputConverter::ConvertToOutputFormat
                (&local_348,&local_2e8->super_cmOutputConverter,&local_328,SHELL);
      std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_348._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_328.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar3) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_238,0,(char *)pbStack_230,0x4f6214);
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)pbStack_210,0x4f6231);
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_278);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_278);
      local_2b8 = &local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CLEAN_ADDITIONAL","");
      local_278._8_8_ = 0;
      local_278._16_8_ = local_278._16_8_ & 0xffffffffffffff00;
      if (local_2b8 == &local_2a8) {
        local_248._8_8_ = local_2a8._8_8_;
        local_258._M_p = (pointer)&local_248;
      }
      else {
        local_258._M_p = (pointer)local_2b8;
      }
      local_1a8._M_allocated_capacity = (size_type)&local_1b8;
      local_250 = local_2b0;
      local_2b0 = 0;
      local_2a8._M_local_buf[0] = '\0';
      local_1b8._M_p = local_1b8._M_p & 0xffffffff00000000;
      local_1b0 = (_Base_ptr)0x0;
      local_238._M_p = (pointer)0x0;
      pbStack_230 = (pointer)0x0;
      local_228._M_allocated_capacity = 0;
      local_228._8_8_ = 0;
      local_218._M_p = (pointer)0x0;
      pbStack_210 = (pointer)0x0;
      local_208._M_allocated_capacity = 0;
      local_208._8_8_ = 0;
      local_1f8._M_p = (pointer)0x0;
      pbStack_1f0 = (pointer)0x0;
      local_1e8._M_allocated_capacity = 0;
      local_1e8._8_8_ = 0;
      local_1d8._M_p = (pointer)0x0;
      pbStack_1d0 = (pointer)0x0;
      local_1c8._M_allocated_capacity = 0;
      local_198._M_p = (pointer)0x0;
      local_190._M_p = local_188 + 8;
      local_188._0_8_ = 0;
      local_188[8] = '\0';
      local_2b8 = &local_2a8;
      local_278._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_278 + 0x10);
      local_1a8._8_8_ = local_1a8._M_allocated_capacity;
      std::__cxx11::string::_M_replace((ulong)local_278,0,(char *)0x0,0x4f6255);
      local_328._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_328,"CMakeFiles/clean.additional","");
      NinjaOutputPath(&local_348,this,&local_328);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                 &local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar3) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      WriteBuild(this,local_2c0,(cmNinjaBuild *)local_278,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_278);
      bVar10 = true;
      goto LAB_0020d550;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  }
  bVar10 = false;
LAB_0020d550:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  cmLocalGenerator* lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs = lgr->GetBinaryDirectory();
  cleanScriptAbs += '/';
  cleanScriptAbs += cleanScriptRel;

  // Check if there are additional files to clean
  if (this->AdditionalCleanFiles.empty()) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\n\n";
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& acf : this->AdditionalCleanFiles) {
      fout << "  "
           << cmOutputConverter::EscapeForCMake(ConvertToNinjaPath(acf))
           << '\n';
    }
    fout << ")\n";
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = CMakeCmd();
    rule.Command += " -P ";
    rule.Command += lgr->ConvertToOutputFormat(
      this->NinjaOutputPath(cleanScriptRel), cmOutputConverter::SHELL);
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.push_back(
      this->NinjaOutputPath(this->GetAdditionalCleanTargetName()));
    WriteBuild(os, build);
  }
  // Return success
  return true;
}